

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O2

void __thiscall Assimp::AMFImporter::~AMFImporter(AMFImporter *this)

{
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0075a958;
  if (this->mReader != (IrrXMLReader *)0x0) {
    (*this->mReader->_vptr_IIrrXMLReader[1])();
  }
  Clear(this);
  std::__cxx11::
  _List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>::
  _M_clear(&(this->mTexture_Converted).
            super__List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
          );
  std::__cxx11::
  _List_base<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>
  ::_M_clear(&(this->mMaterial_Converted).
              super__List_base<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>
            );
  std::__cxx11::string::~string((string *)&this->mUnit);
  std::__cxx11::_List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
  ::_M_clear(&(this->mNodeElement_List).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            );
  BaseImporter::~BaseImporter(&this->super_BaseImporter);
  return;
}

Assistant:

AMFImporter::~AMFImporter()
{
	if(mReader != nullptr) delete mReader;
	// Clear() is accounting if data already is deleted. So, just check again if all data is deleted.
	Clear();
}